

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O2

shared_ptr<helics::helicsCLI11App> __thiscall helics::MultiBroker::generateCLI(MultiBroker *this)

{
  App *this_00;
  Option *pOVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<helics::helicsCLI11App> sVar2;
  string_view localAddress;
  allocator<char> local_ba;
  allocator<char> local_b9;
  undefined1 local_b8 [72];
  string local_70;
  size_type local_50;
  undefined1 auStack_48 [16];
  _Alloc_hider local_38;
  code *local_30;
  code *local_28;
  
  CoreBroker::generateCLI(&this->super_CoreBroker);
  localAddress._M_str = (char *)0x9;
  localAddress._M_len = in_RSI + 0xe98;
  NetworkBrokerData::commandLineParser((NetworkBrokerData *)local_b8,localAddress,true);
  local_b8._32_8_ = local_b8._0_8_;
  local_b8._40_8_ = local_b8._8_8_;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = 0;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  local_b8._48_8_ = local_b8._32_8_;
  local_b8._56_8_ = local_b8._40_8_;
  local_50 = 0;
  auStack_48._0_8_ = 0;
  CLI::App::add_subcommand
            ((App *)(this->super_CoreBroker).super_Broker._vptr_Broker,(App_p *)(local_b8 + 0x30));
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 0x38));
  helicsCLI11App::addTypeOption
            ((helicsCLI11App *)(this->super_CoreBroker).super_Broker._vptr_Broker,true);
  this_00 = (App *)(this->super_CoreBroker).super_Broker._vptr_Broker;
  *(undefined4 *)&this_00[1].description_.field_2 = *(undefined4 *)(in_RSI + 0xfac);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"-_",&local_b9);
  pOVar1 = CLI::App::add_flag<const_char[1],_(CLI::detail::enabler)0>
                     (this_00,&local_70,(char (*) [1])0x3b52e4);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"",&local_ba);
  pOVar1 = CLI::OptionBase<CLI::Option>::group
                     (&pOVar1->super_OptionBase<CLI::Option>,(string *)local_b8);
  pOVar1->force_callback_ = true;
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&local_70);
  local_38._M_p = (pointer)(this->super_CoreBroker).super_Broker._vptr_Broker;
  local_28 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:211:25)>
             ::_M_invoke;
  local_30 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:211:25)>
             ::_M_manager;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)((long)local_38._M_p + 0x90),(function<void_()> *)(auStack_48 + 8)
            );
  CLI::std::_Function_base::~_Function_base((_Function_base *)(auStack_48 + 8));
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_48);
  sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> MultiBroker::generateCLI()
{
    auto app = CoreBroker::generateCLI();
    CLI::App_p netApp = netInfo.commandLineParser("127.0.0.1", false);
    app->add_subcommand(std::move(netApp));
    app->addTypeOption();
    app->setDefaultCoreType(type);
    // this is a null flag option for forcing the callback to run
    app->add_flag("-_", "")->group("")->force_callback();
    auto* app_p = app.get();
    app->final_callback([this, app_p]() {
        auto* copt = app_p->get_parent()->get_option("--config");
        if (copt->count() > 0) {
            configFile = app_p->get_parent()->get_option("--config")->as<std::string>();
        }
        type = app_p->getCoreType();
    });
    return app;
}